

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::normalize_space(char_t *buffer)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  char_t *write;
  byte *pbVar4;
  
  pbVar2 = (byte *)buffer;
  pbVar1 = (byte *)buffer;
LAB_00128c91:
  pbVar4 = pbVar1;
  bVar3 = *pbVar2;
  if ((ulong)bVar3 == 0) {
    if ((pbVar4 != (byte *)buffer) &&
       (buffer = (char_t *)(pbVar4 + -1),
       ((anonymous_namespace)::chartype_table[pbVar4[-1]] & 8) == 0)) {
      buffer = (char_t *)pbVar4;
    }
    *buffer = 0;
    return buffer;
  }
  if (((anonymous_namespace)::chartype_table[bVar3] & 8) != 0) goto LAB_00128ca7;
  pbVar2 = pbVar2 + 1;
  goto LAB_00128cbf;
LAB_00128ca7:
  do {
    pbVar1 = pbVar2 + 1;
    pbVar2 = pbVar2 + 1;
  } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
  bVar3 = 0x20;
  pbVar1 = (byte *)buffer;
  if (pbVar4 != (byte *)buffer) {
LAB_00128cbf:
    *pbVar4 = bVar3;
    pbVar1 = pbVar4 + 1;
  }
  goto LAB_00128c91;
}

Assistant:

PUGI__FN char_t* normalize_space(char_t* buffer)
	{
		char_t* write = buffer;

		for (char_t* it = buffer; *it; )
		{
			char_t ch = *it++;

			if (PUGI__IS_CHARTYPE(ch, ct_space))
			{
				// replace whitespace sequence with single space
				while (PUGI__IS_CHARTYPE(*it, ct_space)) it++;

				// avoid leading spaces
				if (write != buffer) *write++ = ' ';
			}
			else *write++ = ch;
		}

		// remove trailing space
		if (write != buffer && PUGI__IS_CHARTYPE(write[-1], ct_space)) write--;

		// zero-terminate
		*write = 0;

		return write;
	}